

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerConnection.cxx
# Opt level: O3

bool __thiscall cmStdIoConnection::OnConnectionShuttingDown(cmStdIoConnection *this)

{
  uv_stream_t *stream;
  
  stream = (this->super_cmEventBasedConnection).ReadStream;
  if (stream != (uv_stream_t *)0x0) {
    uv_read_stop(stream);
  }
  ShutdownStream((cmStdIoConnection *)stream,&(this->super_cmEventBasedConnection).ReadStream);
  ShutdownStream((cmStdIoConnection *)stream,&(this->super_cmEventBasedConnection).WriteStream);
  cmEventBasedConnection::OnConnectionShuttingDown(&this->super_cmEventBasedConnection);
  return true;
}

Assistant:

bool cmStdIoConnection::OnConnectionShuttingDown()
{
  if (ReadStream) {
    uv_read_stop(ReadStream);
  }

  ShutdownStream(ReadStream);
  ShutdownStream(WriteStream);

  cmEventBasedConnection::OnConnectionShuttingDown();

  return true;
}